

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O2

int mp3dec_decode_frame(mp3dec_t *dec,uint8_t *mp3,int mp3_bytes,mp3d_sample_t *pcm,
                       mp3dec_frame_info_t *info)

{
  long lVar1;
  uint8_t *puVar2;
  L3_gr_info_t *pLVar3;
  char *pcVar4;
  byte bVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ushort uVar11;
  short sVar12;
  short sVar13;
  uint16_t uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined8 uVar28;
  mp3dec_frame_info_t *pmVar29;
  mp3d_sample_t *pmVar30;
  uint8_t uVar31;
  byte bVar32;
  int i;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint32_t uVar36;
  uint uVar37;
  byte *pbVar38;
  byte bVar39;
  sbyte sVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  float (*pafVar44) [576];
  mp3dec_scratch_t *pmVar45;
  float (*pafVar46) [576];
  bool bVar47;
  int iVar48;
  long lVar49;
  float (*pafVar50) [64];
  uint uVar51;
  uint uVar52;
  int iVar53;
  ulong uVar54;
  float *pfVar55;
  uint uVar56;
  L12_scale_info *pLVar57;
  void *pvVar58;
  float *pfVar59;
  uint uVar60;
  int iVar61;
  mp3dec_scratch_t *pmVar62;
  void *__dest;
  uint uVar63;
  uint *puVar64;
  uint uVar65;
  uint uVar66;
  undefined1 *puVar67;
  ulong uVar68;
  ulong uVar69;
  uint8_t (*__src) [39];
  float (*overlap) [288];
  float *dst;
  undefined1 *puVar70;
  bool bVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float *local_4408;
  uint8_t *local_43f8;
  float (*local_43f0) [576];
  uint8_t scf_size [4];
  bs_t bs_frame [1];
  L3_gr_info_t *local_43a0;
  int frame_size;
  mp3dec_frame_info_t *local_4390;
  ulong local_4388;
  ulong local_4380;
  mp3d_sample_t *local_4378;
  uchar *local_4370;
  ulong local_4368;
  uint local_435c;
  uint8_t *local_4358;
  ulong local_4350;
  float *local_4348;
  uint8_t *local_4340;
  L12_scale_info sci [1];
  mp3dec_scratch_t scratch;
  
  bVar32 = 0;
  frame_size = 0;
  local_4390 = info;
  local_4378 = pcm;
  if (((4 < mp3_bytes) && (dec->header[0] == 0xff)) &&
     (iVar61 = hdr_compare(dec->header,mp3), iVar61 != 0)) {
    iVar61 = hdr_frame_bytes(mp3,dec->free_format_bytes);
    iVar48 = hdr_padding(mp3);
    iVar48 = iVar48 + iVar61;
    iVar33 = 0;
    iVar61 = mp3_bytes;
    frame_size = iVar48;
    if (iVar48 == mp3_bytes) goto LAB_0010145d;
    if ((mp3_bytes < iVar48 + 4) || (iVar61 = hdr_compare(mp3,mp3 + iVar48), iVar61 == 0)) {
      frame_size = 0;
    }
    else {
      iVar61 = iVar48;
      if (iVar48 != 0) goto LAB_0010145d;
    }
  }
  memset(dec,0,0x1a0c);
  iVar33 = mp3d_find_frame(mp3,mp3_bytes,&dec->free_format_bytes,&frame_size);
  iVar61 = frame_size;
  if (mp3_bytes < frame_size + iVar33 || frame_size == 0) {
    local_4390->frame_bytes = iVar33;
    return 0;
  }
LAB_0010145d:
  pmVar29 = local_4390;
  *(undefined4 *)dec->header = *(undefined4 *)(mp3 + iVar33);
  local_4390->frame_bytes = iVar61 + iVar33;
  local_4390->frame_offset = iVar33;
  puVar2 = mp3 + iVar33;
  uVar34 = (mp3[(long)iVar33 + 3] < 0xc0) + 1;
  local_4388 = (ulong)uVar34;
  local_4390->channels = uVar34;
  uVar34 = hdr_sample_rate_hz(puVar2);
  pmVar29->hz = uVar34;
  uVar51 = mp3[(long)iVar33 + 1] >> 1 & 3;
  pmVar29->layer = 4 - uVar51;
  uVar34 = hdr_bitrate_kbps(puVar2);
  pmVar29->bitrate_kbps = uVar34;
  if (local_4378 == (mp3d_sample_t *)0x0) {
    uVar34 = hdr_frame_samples(puVar2);
    return uVar34;
  }
  bs_frame[0].buf = puVar2 + 4;
  bs_frame[0].pos = 0;
  bs_frame[0].limit = iVar61 * 8 + -0x20;
  bVar5 = puVar2[1];
  local_4358 = puVar2;
  if ((bVar5 & 1) == 0) {
    get_bits(bs_frame,0x10);
  }
  local_4370 = dec->header;
  if ((char)uVar51 == '\x01') {
    iVar33 = L3_read_side_info(bs_frame,scratch.gr_info,local_4358);
    iVar61 = bs_frame[0].pos;
    if ((-1 < iVar33) && (bs_frame[0].pos <= bs_frame[0].limit)) {
      iVar48 = dec->reserv;
      iVar53 = iVar33;
      if (iVar48 < iVar33) {
        iVar53 = iVar48;
      }
      uVar34 = 0;
      uVar42 = (ulong)(uint)(iVar48 - iVar33);
      if (iVar48 - iVar33 < 1) {
        uVar42 = 0;
      }
      iVar35 = (bs_frame[0].limit - bs_frame[0].pos) / 8;
      memcpy(scratch.maindata,dec->reserv_buf + uVar42,(long)iVar53);
      memcpy(scratch.maindata + iVar53,bs_frame[0].buf + iVar61 / 8,(long)iVar35);
      scratch.bs.buf = scratch.maindata;
      scratch.bs.pos = 0;
      scratch.bs.limit = (iVar35 + iVar53) * 8;
      if (iVar33 <= iVar48) {
        local_4348 = dec->qmf_state;
        uVar34 = 0;
        while (uVar34 < 2 - ((local_4358[1] & 8) == 0)) {
          memset(scratch.grbuf,0,0x1200);
          uVar51 = local_4390->channels;
          local_435c = uVar34;
          lVar49 = (long)(int)(uVar51 * uVar34);
          local_43a0 = scratch.gr_info + lVar49;
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          local_4350 = (ulong)uVar51;
          uVar42 = 0;
LAB_0010169a:
          if (uVar42 != local_4350) {
            local_4388 = (ulong)scratch.bs.pos;
            pLVar3 = local_43a0 + uVar42;
            uVar11 = scratch.gr_info[lVar49 + uVar42].part_23_length;
            puVar67 = L3_decode_scalefactors_g_scf_partitions +
                      (((ulong)(scratch.gr_info[lVar49 + uVar42].n_long_sfb == '\0') + 1) -
                      (ulong)(scratch.gr_info[lVar49 + uVar42].n_short_sfb == '\0')) * 0x1c;
            bVar5 = scratch.gr_info[lVar49 + uVar42].scalefac_scale;
            local_4368 = uVar42;
            if ((dec->header[1] & 8) == 0) {
              bVar39 = uVar42 != 0 & (dec->header[3] & 0x10) >> 4;
              uVar54 = (ulong)(pLVar3->scalefac_compress >> bVar39);
              uVar42 = 0;
              if (bVar39 != 0) {
                uVar42 = 0xc;
              }
              while( true ) {
                if ((int)uVar54 < 0) break;
                uVar69 = 3;
                uVar68 = 1;
                while( true ) {
                  iVar61 = (int)uVar69;
                  if (iVar61 < 0) break;
                  bVar39 = L3_decode_scalefactors_g_mod[(uint)((int)uVar42 + iVar61)];
                  scf_size[uVar69] = (uint8_t)((uVar54 / uVar68) % (ulong)bVar39);
                  uVar68 = (ulong)((int)uVar68 * (uint)bVar39);
                  uVar69 = (ulong)(iVar61 - 1);
                }
                uVar54 = (ulong)(uint)((int)uVar54 - (int)uVar68);
                uVar42 = (ulong)((int)uVar42 + 4);
              }
              puVar67 = puVar67 + uVar42;
              uVar34 = 0xfffffff0;
            }
            else {
              uVar34 = (uint)pLVar3->scfsi;
              scf_size[0] = (byte)L3_decode_scalefactors_g_scfc_decode[pLVar3->scalefac_compress] >>
                            2;
              scf_size[1] = scf_size[0];
              scf_size[2] = L3_decode_scalefactors_g_scfc_decode[pLVar3->scalefac_compress] & 3;
              scf_size[3] = scf_size[2];
            }
            local_4388 = local_4388 + uVar11;
            __src = scratch.ist_pos + local_4368;
            local_4380 = (ulong)bVar5;
            pLVar57 = sci;
            for (lVar43 = 0; (lVar43 != 4 && (uVar42 = (ulong)(byte)puVar67[lVar43], uVar42 != 0));
                lVar43 = lVar43 + 1) {
              if ((uVar34 & 8) == 0) {
                bVar39 = scf_size[lVar43];
                if (bVar39 == 0) {
                  memset(pLVar57,0,uVar42);
                  memset(__src,0,uVar42);
                }
                else {
                  uVar51 = ~(-1 << (bVar39 & 0x1f));
                  if (-1 < (int)uVar34) {
                    uVar51 = 0xffffffff;
                  }
                  for (uVar54 = 0; uVar42 != uVar54; uVar54 = uVar54 + 1) {
                    uVar36 = get_bits(&scratch.bs,(uint)bVar39);
                    *(char *)((long)pLVar57->scf + uVar54) = (char)uVar36;
                    if (uVar36 == uVar51) {
                      uVar36 = 0xff;
                    }
                    (*__src)[uVar54] = (uint8_t)uVar36;
                  }
                }
              }
              else {
                memcpy(pLVar57,__src,uVar42);
              }
              __src = (uint8_t (*) [39])(*__src + uVar42);
              pLVar57 = (L12_scale_info *)((long)pLVar57->scf + uVar42);
              uVar34 = uVar34 * 2;
            }
            *(undefined1 *)((long)pLVar57->scf + 2) = 0;
            *(undefined2 *)pLVar57->scf = 0;
            uVar42 = (ulong)pLVar3->n_short_sfb;
            if (uVar42 == 0) {
              if (pLVar3->preflag != '\0') {
                for (lVar43 = 0; lVar43 != 10; lVar43 = lVar43 + 1) {
                  pcVar4 = (char *)((long)sci[0].scf + lVar43 + 0xb);
                  *pcVar4 = *pcVar4 + (&L3_decode_scalefactors_g_preamp)[lVar43];
                }
              }
            }
            else {
              uVar31 = pLVar3->subblock_gain[0];
              bVar39 = 2 - (char)local_4380;
              uVar6 = pLVar3->subblock_gain[1];
              uVar68 = (ulong)pLVar3->n_long_sfb;
              uVar7 = pLVar3->subblock_gain[2];
              for (uVar54 = 0; uVar54 < uVar42; uVar54 = uVar54 + 3) {
                pcVar4 = (char *)((long)sci[0].scf + uVar54 + uVar68);
                *pcVar4 = *pcVar4 + (uVar31 << (bVar39 & 0x1f));
                pcVar4 = (char *)((long)sci[0].scf + uVar54 + uVar68 + 1);
                *pcVar4 = *pcVar4 + (uVar6 << (bVar39 & 0x1f));
                pcVar4 = (char *)((long)sci[0].scf + uVar54 + uVar68 + 2);
                *pcVar4 = *pcVar4 + (uVar7 << (bVar39 & 0x1f));
              }
            }
            fVar72 = L3_ldexp_q2(2048.0,((uint)((dec->header[3] & 0xe0) == 0x60) * 2 -
                                        (uint)pLVar3->global_gain) + 0x102);
            bVar39 = pLVar3->n_long_sfb;
            for (lVar43 = 0; bVar39 + uVar42 != lVar43; lVar43 = lVar43 + 1) {
              fVar73 = L3_ldexp_q2(fVar72,(uint)*(byte *)((long)sci[0].scf + lVar43) <<
                                          (bVar5 + 1 & 0x1f));
              scratch.scf[lVar43] = fVar73;
            }
            pafVar44 = scratch.grbuf + local_4368;
            uVar63 = (uint)pLVar3->big_values;
            local_43f8 = pLVar3->sfbtab;
            local_4340 = scratch.bs.buf;
            puVar64 = (uint *)((long)(scratch.bs.buf + scratch.bs.pos / 8) + 4);
            uVar34 = *(uint *)(scratch.bs.buf + scratch.bs.pos / 8);
            uVar34 = (uVar34 >> 0x18 | (uVar34 & 0xff0000) >> 8 | (uVar34 & 0xff00) << 8 |
                     uVar34 << 0x18) << ((byte)scratch.bs.pos & 7);
            uVar51 = scratch.bs.pos | 0xfffffff8;
            fVar72 = 0.0;
            local_4408 = scratch.scf;
            lVar43 = 0;
            while (0 < (int)uVar63) {
              bVar5 = pLVar3->table_select[lVar43];
              lVar1 = lVar43 + 1;
              sVar12 = *(short *)(L3_huffman_tabindex + (ulong)bVar5 * 2);
              uVar52 = uVar63;
              uVar41 = (uint)pLVar3->region_count[lVar43];
              if (bVar5 < 0x10) {
                do {
                  uVar60 = (uint)(*local_43f8 >> 1);
                  uVar63 = uVar60;
                  if (uVar52 < uVar60) {
                    uVar63 = uVar52;
                  }
                  fVar72 = *local_4408;
                  do {
                    pafVar46 = pafVar44;
                    uVar56 = uVar34 >> 0x1b;
                    uVar37 = 5;
                    while( true ) {
                      sVar13 = *(short *)(L3_huffman_tabs + (ulong)uVar56 * 2 + (long)sVar12 * 2);
                      uVar56 = (uint)sVar13;
                      uVar42 = (ulong)uVar56;
                      if (-1 < (int)uVar56) break;
                      uVar34 = uVar34 << (sbyte)uVar37;
                      uVar51 = uVar51 + uVar37;
                      uVar37 = uVar56 & 7;
                      uVar56 = (uVar34 >> (-(char)uVar37 & 0x1fU)) - ((int)uVar56 >> 3);
                    }
                    uVar34 = uVar34 << ((byte)((ushort)sVar13 >> 8) & 0x1f);
                    uVar51 = uVar51 + (uVar56 >> 8);
                    for (lVar43 = 0; (int)lVar43 != 8; lVar43 = lVar43 + 4) {
                      uVar37 = uVar34 >> 0x1b;
                      bVar71 = (uVar42 & 0xf) != 0;
                      uVar34 = uVar34 << bVar71;
                      *(float *)((long)*pafVar46 + lVar43) =
                           g_pow43[(uVar37 & 0xfffffff0 | (uint)uVar42 & 0xf) ^ 0x10] * fVar72;
                      uVar51 = uVar51 + bVar71;
                      uVar42 = uVar42 >> 4;
                    }
                    for (; -1 < (int)uVar51; uVar51 = uVar51 - 8) {
                      uVar37 = *puVar64;
                      puVar64 = (uint *)((long)puVar64 + 1);
                      uVar34 = uVar34 | (uint)(byte)uVar37 << ((byte)uVar51 & 0x1f);
                    }
                    uVar63 = uVar63 - 1;
                    pafVar44 = (float (*) [576])((long)*pafVar46 + lVar43);
                  } while (uVar63 != 0);
                  local_43f8 = local_43f8 + 1;
                  local_4408 = local_4408 + 1;
                  uVar63 = uVar52 - uVar60;
                  if (uVar63 == 0 || (int)uVar52 < (int)uVar60) break;
                  pafVar44 = (float (*) [576])((long)*pafVar46 + lVar43);
                  bVar71 = 0 < (int)uVar41;
                  uVar52 = uVar63;
                  uVar41 = uVar41 - 1;
                } while (bVar71);
                pafVar44 = (float (*) [576])((long)*pafVar46 + lVar43);
                lVar43 = lVar1;
              }
              else {
                bVar5 = L3_huffman_g_linbits[bVar5];
                do {
                  uVar60 = (uint)(*local_43f8 >> 1);
                  local_4380 = CONCAT44(local_4380._4_4_,uVar60);
                  uVar63 = uVar60;
                  if (uVar52 < uVar60) {
                    uVar63 = uVar52;
                  }
                  fVar72 = *local_4408;
                  do {
                    uVar56 = uVar34 >> 0x1b;
                    uVar37 = 5;
                    while( true ) {
                      sVar13 = *(short *)(L3_huffman_tabs + (ulong)uVar56 * 2 + (long)sVar12 * 2);
                      uVar56 = (uint)sVar13;
                      if (-1 < sVar13) break;
                      uVar34 = uVar34 << (sbyte)uVar37;
                      uVar51 = uVar51 + uVar37;
                      uVar37 = uVar56 & 7;
                      uVar56 = (uVar34 >> (-(char)uVar37 & 0x1fU)) - ((int)uVar56 >> 3);
                    }
                    uVar34 = uVar34 << ((byte)((ushort)sVar13 >> 8) & 0x1f);
                    uVar51 = uVar51 + (uVar56 >> 8);
                    for (iVar61 = 0; iVar61 != 2; iVar61 = iVar61 + 1) {
                      uVar37 = uVar56 & 0xf;
                      if (uVar37 == 0xf) {
                        uVar66 = uVar34 << (bVar5 & 0x1f);
                        for (uVar51 = uVar51 + bVar5; -1 < (int)uVar51; uVar51 = uVar51 - 8) {
                          uVar37 = *puVar64;
                          puVar64 = (uint *)((long)puVar64 + 1);
                          uVar66 = uVar66 | (uint)(byte)uVar37 << ((byte)uVar51 & 0x1f);
                        }
                        uVar34 = uVar34 >> (0x20 - bVar5 & 0x1f);
                        uVar37 = uVar34 + 0xf;
                        if ((int)uVar37 < 0x81) {
                          fVar73 = g_pow43[(int)(uVar34 + 0x1f)];
                        }
                        else {
                          uVar34 = uVar37 * 8;
                          if (uVar37 >= 0x400) {
                            uVar34 = uVar37;
                          }
                          uVar65 = uVar34 * 2 & 0x40;
                          fVar73 = (float)(int)((uVar34 & 0x3f) - uVar65) /
                                   (float)(int)((uVar34 & 0x7fffffc0) + uVar65);
                          fVar73 = ((fVar73 * 0.22222222 + 1.3333334) * fVar73 + 1.0) *
                                   g_pow43[(ulong)(uVar65 + uVar34 >> 6) + 0x10] *
                                   *(float *)(&DAT_00107190 + (ulong)(uVar37 < 0x400) * 4);
                        }
                        fVar73 = (float)(int)((int)uVar66 >> 0x1f | 1) * fVar73 * fVar72;
                        uVar34 = uVar66;
                      }
                      else {
                        fVar73 = g_pow43[(uVar34 >> 0x1b & 0xfffffff0 | uVar37) ^ 0x10] * fVar72;
                      }
                      (*pafVar44)[0] = fVar73;
                      uVar34 = uVar34 << (uVar37 != 0);
                      uVar51 = uVar51 + (uVar37 != 0);
                      pafVar44 = (float (*) [576])(*pafVar44 + 1);
                      uVar56 = uVar56 >> 4;
                    }
                    for (; -1 < (int)uVar51; uVar51 = uVar51 - 8) {
                      uVar37 = *puVar64;
                      puVar64 = (uint *)((long)puVar64 + 1);
                      uVar34 = uVar34 | (uint)(byte)uVar37 << ((byte)uVar51 & 0x1f);
                    }
                    uVar63 = uVar63 - 1;
                  } while (uVar63 != 0);
                  local_43f8 = local_43f8 + 1;
                  local_4408 = local_4408 + 1;
                  uVar63 = uVar52 - uVar60;
                  lVar43 = lVar1;
                } while ((uVar63 != 0 && (int)uVar60 <= (int)uVar52) &&
                        (bVar71 = 0 < (int)uVar41, uVar52 = uVar63, uVar41 = uVar41 - 1, bVar71));
              }
            }
            uVar63 = 1 - uVar63;
            puVar67 = L3_huffman_tab33;
            if (pLVar3->count1_table == '\0') {
              puVar67 = L3_huffman_tab32;
            }
            do {
              bVar5 = puVar67[uVar34 >> 0x1c];
              if ((bVar5 & 8) == 0) {
                bVar5 = puVar67[(ulong)((uVar34 << 4) >> (-(bVar5 & 3) & 0x1f)) +
                                (ulong)(bVar5 >> 3)];
              }
              uVar41 = bVar5 & 7;
              sVar40 = (sbyte)uVar41;
              uVar52 = uVar34 << sVar40;
              uVar51 = uVar41 + uVar51;
              if ((long)local_4388 <
                  (long)(int)uVar51 + ((long)puVar64 - (long)scratch.bs.buf) * 8 + -0x18)
              goto LAB_00101ecd;
              uVar63 = uVar63 - 1;
              if (uVar63 == 0) {
                bVar39 = *local_43f8;
                if (bVar39 < 2) goto LAB_00101ecd;
                local_43f8 = local_43f8 + 1;
                uVar63 = (uint)(bVar39 >> 1);
                fVar72 = *local_4408;
                local_4408 = local_4408 + 1;
              }
              if (0x7f < bVar5) {
                fVar73 = fVar72;
                if ((int)(uVar34 << sVar40) < 0) {
                  fVar73 = -fVar72;
                }
                (*pafVar44)[0] = fVar73;
                uVar51 = uVar51 + 1;
                uVar52 = uVar52 * 2;
              }
              uVar34 = uVar52;
              if ((bVar5 & 0x40) != 0) {
                fVar73 = fVar72;
                if ((int)uVar34 < 0) {
                  fVar73 = -fVar72;
                }
                (*pafVar44)[1] = fVar73;
                uVar34 = uVar34 * 2;
                uVar51 = uVar51 + 1;
              }
              uVar63 = uVar63 - 1;
              if (uVar63 == 0) {
                bVar39 = *local_43f8;
                if (bVar39 < 2) goto LAB_00101ecd;
                local_43f8 = local_43f8 + 1;
                uVar63 = (uint)(bVar39 >> 1);
                fVar72 = *local_4408;
                local_4408 = local_4408 + 1;
              }
              if ((bVar5 & 0x20) != 0) {
                fVar73 = fVar72;
                if ((int)uVar34 < 0) {
                  fVar73 = -fVar72;
                }
                (*pafVar44)[2] = fVar73;
                uVar34 = uVar34 * 2;
                uVar51 = uVar51 + 1;
              }
              if ((bVar5 & 0x10) != 0) {
                fVar73 = fVar72;
                if ((int)uVar34 < 0) {
                  fVar73 = -fVar72;
                }
                (*pafVar44)[3] = fVar73;
                uVar34 = uVar34 * 2;
                uVar51 = uVar51 + 1;
              }
              for (; -1 < (int)uVar51; uVar51 = uVar51 - 8) {
                uVar52 = *puVar64;
                puVar64 = (uint *)((long)puVar64 + 1);
                uVar34 = uVar34 | (uint)(byte)uVar52 << ((byte)uVar51 & 0x1f);
              }
              pafVar44 = (float (*) [576])(*pafVar44 + 4);
            } while( true );
          }
          bVar5 = dec->header[3];
          if ((bVar5 & 0x10) == 0) {
            if ((bVar5 & 0xe0) == 0x60) {
              L3_midside_stereo(scratch.grbuf[0],0x240);
            }
          }
          else {
            bVar39 = scratch.gr_info[lVar49].n_long_sfb;
            sci[0].scf[2] = -NAN;
            bVar8 = scratch.gr_info[lVar49].n_short_sfb;
            sci[0].scf[0] = -NAN;
            sci[0].scf[1] = -NAN;
            uVar34 = (uint)bVar8 + (uint)bVar39;
            puVar2 = local_43a0->sfbtab;
            pafVar44 = scratch.grbuf + 1;
            for (uVar42 = 0; uVar42 != uVar34; uVar42 = uVar42 + 1) {
              bVar9 = puVar2[uVar42];
              uVar54 = 0;
              while( true ) {
                if (bVar9 <= uVar54) goto LAB_00101fb9;
                if (((*pafVar44)[uVar54] != 0.0) || (NAN((*pafVar44)[uVar54]))) break;
                lVar43 = uVar54 + 1;
                uVar54 = uVar54 + 2;
                if (((*pafVar44)[lVar43] != 0.0) || (NAN((*pafVar44)[lVar43]))) break;
              }
              sci[0].scf[(uVar42 & 0xffffffff) % 3] = (float)uVar42;
LAB_00101fb9:
              pafVar44 = (float (*) [576])(*pafVar44 + bVar9);
            }
            if (bVar39 != 0) {
              if ((int)sci[0].scf[1] < (int)sci[0].scf[0]) {
                sci[0].scf[1] = sci[0].scf[0];
              }
              if ((int)sci[0].scf[1] <= (int)sci[0].scf[2]) {
                sci[0].scf[1] = sci[0].scf[2];
              }
              sci[0].scf[2] = sci[0].scf[1];
              sci[0].scf[0] = sci[0].scf[1];
            }
            uVar51 = (uint)(bVar8 != 0) * 2 + 1;
            lVar43 = (long)(int)(uVar34 - uVar51) + -0x59;
            for (uVar42 = 0; uVar42 != uVar51; uVar42 = uVar42 + 1) {
              if ((int)sci[0].scf[uVar42] < (int)(uVar34 + uVar51 * -2 + (int)uVar42)) {
                bVar39 = *(byte *)((long)&scratch + uVar42 + (lVar43 - (ulong)uVar51) + 0x3fb0);
              }
              else {
                bVar39 = (char)(dec->header[1] << 4) >> 7 & 3;
              }
              scratch.ist_pos[1][uVar42 + lVar43 + 0x59] = bVar39;
            }
            puVar2 = local_43a0->sfbtab;
            uVar14 = scratch.gr_info[lVar49 + 1].scalefac_compress;
            bVar39 = dec->header[1];
            bVar8 = 7;
            if ((bVar39 & 8) == 0) {
              bVar8 = 0x40;
            }
            fVar72 = *(float *)(&DAT_00107198 + (ulong)((bVar5 & 0x20) == 0) * 4);
            uVar34 = 0;
            pafVar44 = scratch.grbuf;
            while( true ) {
              uVar42 = (ulong)uVar34;
              bVar9 = puVar2[uVar42];
              if ((ulong)bVar9 == 0) break;
              if ((int)sci[0].scf[uVar42 % 3] < (int)uVar34) {
                bVar10 = scratch.ist_pos[1][uVar42];
                if (bVar8 <= bVar10) goto LAB_0010212f;
                if ((bVar39 & 8) == 0) {
                  fVar74 = L3_ldexp_q2(1.0,(bVar10 + 1 >> 1) << ((byte)uVar14 & 1));
                  if ((bVar10 & 1) == 0) {
                    fVar73 = fVar74;
                    fVar74 = 1.0;
                  }
                  else {
                    fVar73 = 1.0;
                  }
                }
                else {
                  fVar73 = *(float *)(L3_stereo_process_g_pan + (ulong)bVar10 * 8 + 4);
                  fVar74 = *(float *)(L3_stereo_process_g_pan + (ulong)bVar10 * 8);
                }
                for (uVar54 = 0; bVar9 != uVar54; uVar54 = uVar54 + 1) {
                  pafVar44[1][uVar54] = fVar73 * fVar72 * (*pafVar44)[uVar54];
                  (*pafVar44)[uVar54] = (*pafVar44)[uVar54] * fVar74 * fVar72;
                }
              }
              else {
LAB_0010212f:
                if ((bVar5 & 0x20) != 0) {
                  L3_midside_stereo(*pafVar44,(uint)bVar9);
                }
              }
              pafVar44 = (float (*) [576])(*pafVar44 + puVar2[uVar42]);
              uVar34 = uVar34 + 1;
            }
          }
          pmVar62 = &scratch;
          for (uVar42 = 0; pmVar30 = local_4378, pmVar29 = local_4390, uVar42 != local_4350;
              uVar42 = uVar42 + 1) {
            uVar31 = local_43a0->mixed_block_flag;
            iVar53 = (uint)(uVar31 != '\0') * 2 <<
                     ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) * '\x03'
                            + (dec->header[2] >> 2 & 3)) == '\x02');
            iVar61 = 0x1f;
            if (local_43a0->n_short_sfb != '\0') {
              __dest = (void *)((long)scratch.grbuf[uVar42] + (ulong)(uint)(iVar53 * 0x48));
              pbVar38 = local_43a0->sfbtab + local_43a0->n_long_sfb;
              pafVar50 = scratch.syn;
              pvVar58 = __dest;
              while( true ) {
                uVar54 = (ulong)*pbVar38;
                if (uVar54 == 0) break;
                uVar34 = (uint)*pbVar38 * 4;
                for (lVar49 = 0; uVar34 != (uint)lVar49; lVar49 = lVar49 + 4) {
                  (*pafVar50)[0] = *(float *)((long)pvVar58 + lVar49);
                  (*pafVar50)[1] = *(float *)((long)pvVar58 + lVar49 + (ulong)uVar34);
                  (*pafVar50)[2] = *(float *)((long)pvVar58 + lVar49 + uVar54 * 8);
                  pafVar50 = (float (*) [64])(*pafVar50 + 3);
                }
                pbVar38 = pbVar38 + 3;
                pvVar58 = (void *)((long)pvVar58 + lVar49 + uVar54 * 8);
              }
              iVar61 = iVar53 + -1;
              memcpy(__dest,scratch.syn,(long)pafVar50 - (long)scratch.syn);
            }
            local_43f0 = scratch.grbuf + uVar42;
            pafVar44 = local_43f0;
            for (; 0 < iVar61; iVar61 = iVar61 + -1) {
              lVar49 = 0;
              bVar71 = true;
              do {
                bVar47 = bVar71;
                pfVar55 = *pafVar44 + lVar49 + 0x12;
                fVar72 = *pfVar55;
                fVar73 = pfVar55[1];
                fVar74 = pfVar55[2];
                fVar15 = pfVar55[3];
                fVar16 = *(float *)((long)pafVar44 + (0xe - lVar49) * 4);
                fVar17 = *(float *)((long)pafVar44 + (0xf - lVar49) * 4);
                fVar18 = *(float *)((long)pafVar44 + (0x10 - lVar49) * 4);
                fVar19 = *(float *)((long)pafVar44 + (0x11 - lVar49) * 4);
                lVar43 = lVar49 * 4;
                fVar20 = *(float *)(L3_antialias_g_aa + lVar43);
                fVar21 = *(float *)(L3_antialias_g_aa + lVar43 + 4);
                fVar22 = *(float *)(L3_antialias_g_aa + lVar43 + 8);
                fVar23 = *(float *)(L3_antialias_g_aa + lVar43 + 0xc);
                lVar43 = lVar49 * 4;
                fVar24 = *(float *)(L3_antialias_g_aa + lVar43 + 0x20);
                fVar25 = *(float *)(L3_antialias_g_aa + lVar43 + 0x24);
                fVar26 = *(float *)(L3_antialias_g_aa + lVar43 + 0x28);
                fVar27 = *(float *)(L3_antialias_g_aa + lVar43 + 0x2c);
                pfVar55 = *pafVar44 + lVar49 + 0x12;
                *pfVar55 = fVar72 * fVar20 - fVar19 * fVar24;
                pfVar55[1] = fVar73 * fVar21 - fVar18 * fVar25;
                pfVar55[2] = fVar74 * fVar22 - fVar17 * fVar26;
                pfVar55[3] = fVar15 * fVar23 - fVar16 * fVar27;
                *(float *)((long)pafVar44 + (0xe - lVar49) * 4) = fVar16 * fVar23 + fVar15 * fVar27;
                *(float *)((long)pafVar44 + (0xf - lVar49) * 4) = fVar17 * fVar22 + fVar74 * fVar26;
                *(float *)((long)pafVar44 + (0x10 - lVar49) * 4) = fVar18 * fVar21 + fVar73 * fVar25
                ;
                *(float *)((long)pafVar44 + (0x11 - lVar49) * 4) = fVar19 * fVar20 + fVar72 * fVar24
                ;
                lVar49 = 4;
                bVar71 = false;
              } while (bVar47);
              pafVar44 = (float (*) [576])(*pafVar44 + 0x12);
            }
            overlap = dec->mdct_overlap + uVar42;
            uVar6 = local_43a0->block_type;
            if (uVar31 != '\0') {
              L3_imdct36(*local_43f0,*overlap,(float *)L3_imdct_gr_g_mdct_window,iVar53);
              local_43f0 = (float (*) [576])((long)*local_43f0 + (ulong)(uint)(iVar53 * 0x48));
              overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar53 * 0x24));
            }
            if (uVar6 == '\x02') {
              lVar49 = 0;
              for (iVar53 = 0x20 - iVar53; 0 < iVar53; iVar53 = iVar53 + -1) {
                pfVar55 = (float *)((long)*local_43f0 + lVar49 * 2);
                dst = (float *)((long)*overlap + lVar49);
                pfVar59 = pfVar55;
                pLVar57 = sci;
                for (lVar43 = 0x12; lVar43 != 0; lVar43 = lVar43 + -1) {
                  pLVar57->scf[0] = *pfVar59;
                  pfVar59 = pfVar59 + (ulong)bVar32 * -2 + 1;
                  pLVar57 = (L12_scale_info *)((long)pLVar57 + (ulong)bVar32 * -8 + 4);
                }
                *(undefined8 *)(pfVar55 + 4) = *(undefined8 *)(dst + 4);
                uVar28 = *(undefined8 *)(dst + 2);
                *(undefined8 *)pfVar55 = *(undefined8 *)dst;
                *(undefined8 *)(pfVar55 + 2) = uVar28;
                pfVar59 = dst + 6;
                L3_imdct12(sci[0].scf,pfVar55 + 6,pfVar59);
                L3_imdct12(sci[0].scf + 1,pfVar55 + 0xc,pfVar59);
                L3_imdct12(sci[0].scf + 2,dst,pfVar59);
                lVar49 = lVar49 + 0x24;
              }
            }
            else {
              L3_imdct36(*local_43f0,*overlap,
                         (float *)(L3_imdct_gr_g_mdct_window + (ulong)(uVar6 == '\x03') * 0x48),
                         0x20 - iVar53);
            }
            pmVar45 = pmVar62;
            for (uVar34 = 0; uVar34 < 0x20; uVar34 = uVar34 + 2) {
              for (lVar49 = 0x2f7; lVar49 - 0x2f6U < 0x12; lVar49 = lVar49 + 2) {
                *(uint *)(pmVar45->maindata + lVar49 * 4 + -0x10) =
                     *(uint *)(pmVar45->maindata + lVar49 * 4 + -0x10) ^ 0x80000000;
              }
              pmVar45 = (mp3dec_scratch_t *)(pmVar45->maindata + 0x80);
            }
            local_43a0 = local_43a0 + 1;
            pmVar62 = (mp3dec_scratch_t *)(pmVar62->maindata + 0x8f0);
          }
          mp3d_synth_granule(local_4348,scratch.grbuf[0],0x12,local_4390->channels,local_4378,
                             scratch.syn[0]);
          local_4378 = pmVar30 + (long)pmVar29->channels * 0x240;
          uVar34 = local_435c + 1;
        }
        uVar34 = scratch.bs.pos + 7U >> 3;
      }
      uVar63 = ((uint)scratch.bs.limit >> 3) - uVar34;
      uVar51 = 0x1ff;
      if ((int)uVar63 < 0x1ff) {
        uVar51 = uVar63;
      }
      if (0 < (int)uVar63) {
        if (0x1ff < uVar63) {
          uVar34 = ((uint)scratch.bs.limit >> 3) - 0x1ff;
        }
        memcpy(dec->reserv_buf,scratch.maindata + uVar34,(ulong)uVar51);
      }
      uVar34 = (uint)(iVar33 <= iVar48);
      dec->reserv = uVar51;
LAB_001026dd:
      uVar51 = hdr_frame_samples(local_4370);
      return uVar51 * uVar34;
    }
  }
  else {
    uVar34 = 0x20;
    bVar32 = local_4358[3] >> 6;
    if (bVar32 == 3) {
      uVar51 = 0;
    }
    else if (bVar32 == 1) {
      uVar51 = (local_4358[3] >> 2 & 0xc) + 4;
    }
    else {
      uVar51 = 0x20;
    }
    if ((~bVar5 & 6) == 0) {
      puVar67 = &L12_subband_alloc_table_g_alloc_L1;
    }
    else if ((bVar5 & 8) == 0) {
      puVar67 = &L12_subband_alloc_table_g_alloc_L2M2;
      uVar34 = 0x1e;
    }
    else {
      bVar39 = local_4358[2] >> 2 & 3;
      uVar63 = hdr_bitrate_kbps(local_4358);
      uVar34 = 0xc0;
      if (uVar63 >> (bVar32 != 3) != 0) {
        uVar34 = uVar63 >> (bVar32 != 3);
      }
      if (uVar34 < 0x38) {
        uVar34 = (uint)(bVar39 == 2) * 4 + 8;
        puVar67 = (undefined1 *)&L12_subband_alloc_table_g_alloc_L2M1_lowrate;
      }
      else {
        bVar71 = bVar39 != 1 && 0x5f < uVar34;
        uVar34 = (uint)bVar71 + (uint)bVar71 * 2 + 0x1b;
        puVar67 = L12_subband_alloc_table_g_alloc_L2M1;
      }
    }
    local_43f8 = sci[0].bitalloc;
    sci[0].total_bands = (uint8_t)uVar34;
    uVar63 = uVar34;
    if (uVar51 < uVar34) {
      uVar63 = uVar51;
    }
    uVar42 = (ulong)uVar63;
    sci[0].stereo_bands = (uint8_t)uVar63;
    puVar70 = L12_read_scale_info_g_bitalloc_code_tab;
    uVar54 = 0;
    uVar63 = 0;
    for (uVar68 = 0; uVar34 != uVar68; uVar68 = uVar68 + 1) {
      if (uVar68 == uVar54) {
        uVar54 = (ulong)((int)uVar54 + (uint)(byte)puVar67[2]);
        uVar63 = (uint)(byte)puVar67[1];
        puVar70 = L12_read_scale_info_g_bitalloc_code_tab + (byte)*puVar67;
        puVar67 = puVar67 + 3;
      }
      uVar36 = get_bits(bs_frame,uVar63);
      uVar31 = puVar70[uVar36];
      sci[0].bitalloc[uVar68 * 2] = uVar31;
      if (uVar68 < uVar42) {
        uVar36 = get_bits(bs_frame,uVar63);
        uVar31 = puVar70[uVar36];
      }
      if (uVar51 == 0) {
        uVar31 = '\0';
      }
      sci[0].bitalloc[uVar68 * 2 + 1] = uVar31;
    }
    for (uVar54 = 0; uVar34 * 2 != uVar54; uVar54 = uVar54 + 1) {
      bVar32 = (sci[0].bitalloc[uVar54] == '\0') << 2 | 2;
      if ((sci[0].bitalloc[uVar54] != '\0') && ((bVar5 & 6) != 6)) {
        uVar36 = get_bits(bs_frame,2);
        bVar32 = (byte)uVar36;
      }
      sci[0].scfcod[uVar54] = bVar32;
    }
    pLVar57 = sci;
    for (uVar54 = 0; uVar54 != uVar34 * 2; uVar54 = uVar54 + 1) {
      bVar32 = *local_43f8;
      if (bVar32 == 0) {
        uVar51 = 0;
      }
      else {
        uVar51 = 0x13U >> (sci[0].scfcod[uVar54] & 0x1f) | 4;
      }
      local_43f8 = local_43f8 + 1;
      fVar72 = 0.0;
      for (uVar63 = 4; uVar63 != 0; uVar63 = uVar63 >> 1) {
        if ((uVar63 & uVar51) != 0) {
          uVar36 = get_bits(bs_frame,6);
          fVar72 = (float)(int)(0x200000 >> ((byte)((int)uVar36 / 3) & 0x1f)) *
                   *(float *)(L12_read_scalefactors_g_deq_L12 +
                             (long)(int)((int)uVar36 % 3 + (uint)bVar32 + (uint)bVar32 * 2 + -6) * 4
                             );
        }
        pLVar57->scf[0] = fVar72;
        pLVar57 = (L12_scale_info *)(pLVar57->scf + 1);
      }
    }
    for (; uVar34 != uVar42; uVar42 = uVar42 + 1) {
      sci[0].bitalloc[uVar42 * 2 + 1] = '\0';
    }
    lVar49 = 0;
    memset(scratch.grbuf,0,0x1200);
    iVar61 = 0;
    do {
      uVar34 = 1;
      if (lVar49 == 3) goto LAB_001026dd;
      uVar42 = (long)local_4390->layer | 1;
      iVar33 = (int)uVar42;
      uVar54 = 0;
      if (0 < iVar33) {
        uVar54 = (ulong)(uint)local_4390->layer | 1;
      }
      local_4380 = (ulong)sci[0].total_bands;
      uVar34 = (uint)sci[0].total_bands;
      iVar48 = 0x240;
      for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
        pfVar55 = scratch.grbuf[0] + (long)iVar61 + lVar43 * uVar42;
        for (uVar68 = 0; uVar68 != uVar34 * 2; uVar68 = uVar68 + 1) {
          bVar32 = sci[0].bitalloc[uVar68];
          if (bVar32 != 0) {
            if (bVar32 < 0x11) {
              for (uVar69 = 0; uVar54 != uVar69; uVar69 = uVar69 + 1) {
                uVar36 = get_bits(bs_frame,(uint)bVar32);
                pfVar55[uVar69] = (float)(int)(uVar36 + (-1 << (bVar32 - 1 & 0x1f)) + 1);
              }
            }
            else {
              uVar51 = 2 << (bVar32 - 0x11 & 0x1f);
              uVar36 = get_bits(bs_frame,(uVar51 - (uVar51 >> 3)) + 3);
              for (uVar69 = 0; uVar54 != uVar69; uVar69 = uVar69 + 1) {
                pfVar55[uVar69] = (float)(int)(uVar36 % (uVar51 + 1) - (uVar51 >> 1));
                uVar36 = uVar36 / (uVar51 + 1);
              }
            }
          }
          pfVar55 = pfVar55 + iVar48;
          iVar48 = 0x12 - iVar48;
        }
      }
      iVar61 = iVar61 + iVar33 * 4;
      if (iVar61 == 0xc) {
        pfVar55 = sci[0].scf + lVar49;
        pafVar44 = scratch.grbuf;
        memcpy((void *)((long)scratch.grbuf[1] + (ulong)((uint)sci[0].stereo_bands * 0x48)),
               (void *)((long)*pafVar44 + (ulong)((uint)sci[0].stereo_bands * 0x48)),
               (local_4380 - sci[0].stereo_bands) * 0x48);
        pmVar30 = local_4378;
        pafVar46 = pafVar44;
        for (iVar61 = 0; iVar61 != (int)local_4380; iVar61 = iVar61 + 1) {
          fVar72 = *pfVar55;
          fVar73 = pfVar55[3];
          for (lVar43 = 0; lVar43 != 0xc; lVar43 = lVar43 + 1) {
            (*pafVar46)[lVar43] = (*pafVar46)[lVar43] * fVar72;
            pafVar46[1][lVar43] = pafVar46[1][lVar43] * fVar73;
          }
          pafVar46 = (float (*) [576])(*pafVar46 + 0x12);
          pfVar55 = pfVar55 + 6;
        }
        mp3d_synth_granule(dec->qmf_state,*pafVar44,0xc,(int)local_4388,local_4378,scratch.syn[0]);
        iVar61 = 0;
        memset(pafVar44,0,0x1200);
        local_4388 = (long)local_4390->channels;
        local_4378 = pmVar30 + (long)local_4390->channels * 0x180;
      }
      lVar49 = lVar49 + 1;
    } while (bs_frame[0].pos <= bs_frame[0].limit);
  }
  *local_4370 = '\0';
  return 0;
LAB_00101ecd:
  scratch.bs.pos = (int)local_4388;
  uVar42 = local_4368 + 1;
  goto LAB_0010169a;
}

Assistant:

int mp3dec_decode_frame(mp3dec_t *dec, const uint8_t *mp3, int mp3_bytes, mp3d_sample_t *pcm, mp3dec_frame_info_t *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const uint8_t *hdr;
    bs_t bs_frame[1];
    mp3dec_scratch_t scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && hdr_compare(dec->header, mp3))
    {
        frame_size = hdr_frame_bytes(mp3, dec->free_format_bytes) + hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + HDR_SIZE > mp3_bytes || !hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(mp3dec_t));
        i = mp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->frame_offset = i;
    info->channels = HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = hdr_sample_rate_hz(hdr);
    info->layer = 4 - HDR_GET_LAYER(hdr);
    info->bitrate_kbps = hdr_bitrate_kbps(hdr);

    if (!pcm)
    {
        return hdr_frame_samples(hdr);
    }

    bs_init(bs_frame, hdr + HDR_SIZE, frame_size - HDR_SIZE);
    if (HDR_IS_CRC(hdr))
    {
        get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            mp3dec_init(dec);
            return 0;
        }
        success = L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success)
        {
            for (igr = 0; igr < (HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm += 576*info->channels)
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, pcm, scratch.syn[0]);
            }
        }
        L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef MINIMP3_ONLY_MP3
        return 0;
#else /* MINIMP3_ONLY_MP3 */
        L12_scale_info sci[1];
        L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                mp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm += 384*info->channels;
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                mp3dec_init(dec);
                return 0;
            }
        }
#endif /* MINIMP3_ONLY_MP3 */
    }
    return success*hdr_frame_samples(dec->header);
}